

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.h
# Opt level: O2

_Bool upb_MiniTableEnum_CheckValue(upb_MiniTableEnum *e,uint32_t val)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint uVar3;
  _Bool _Var4;
  
  if (val < 0x40) {
    _Var4 = ((ulong)e[1] >> ((ulong)val & 0x3f) & 1) != 0;
  }
  else if (val < e->mask_limit_dont_copy_me__upb_internal_use_only) {
    _Var4 = ((&e[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] >> (val & 0x1f) & 1)
            != 0;
  }
  else {
    uVar3 = e->mask_limit_dont_copy_me__upb_internal_use_only >> 5;
    puVar2 = &e[1].mask_limit_dont_copy_me__upb_internal_use_only + uVar3;
    do {
      _Var4 = puVar2 < &e[1].mask_limit_dont_copy_me__upb_internal_use_only +
                       (uVar3 + e->value_count_dont_copy_me__upb_internal_use_only);
      if (!_Var4) {
        return _Var4;
      }
      uVar1 = *puVar2;
      puVar2 = puVar2 + 1;
    } while (uVar1 != val);
  }
  return _Var4;
}

Assistant:

UPB_API_INLINE bool upb_MiniTableEnum_CheckValue(
    const struct upb_MiniTableEnum* e, uint32_t val) {
  if (UPB_LIKELY(val < 64)) {
    const uint64_t mask =
        e->UPB_PRIVATE(data)[0] | ((uint64_t)e->UPB_PRIVATE(data)[1] << 32);
    const uint64_t bit = 1ULL << val;
    return (mask & bit) != 0;
  }
  if (UPB_LIKELY(val < e->UPB_PRIVATE(mask_limit))) {
    const uint32_t mask = e->UPB_PRIVATE(data)[val / 32];
    const uint32_t bit = 1ULL << (val % 32);
    return (mask & bit) != 0;
  }

  // OPT: binary search long lists?
  const uint32_t* start =
      &e->UPB_PRIVATE(data)[e->UPB_PRIVATE(mask_limit) / 32];
  const uint32_t* limit = &e->UPB_PRIVATE(
      data)[e->UPB_PRIVATE(mask_limit) / 32 + e->UPB_PRIVATE(value_count)];
  for (const uint32_t* p = start; p < limit; p++) {
    if (*p == val) return true;
  }
  return false;
}